

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O0

void opj_t1_dec_clnpass(opj_t1_t *t1,OPJ_INT32 bpno,OPJ_INT32 cblksty)

{
  OPJ_INT32 cblksty_local;
  OPJ_INT32 bpno_local;
  opj_t1_t *t1_local;
  
  if ((t1->w == 0x40) && (t1->h == 0x40)) {
    if ((cblksty & 8U) == 0) {
      opj_t1_dec_clnpass_64x64_novsc(t1,bpno);
    }
    else {
      opj_t1_dec_clnpass_64x64_vsc(t1,bpno);
    }
  }
  else if ((cblksty & 8U) == 0) {
    opj_t1_dec_clnpass_generic_novsc(t1,bpno);
  }
  else {
    opj_t1_dec_clnpass_generic_vsc(t1,bpno);
  }
  opj_t1_dec_clnpass_check_segsym(t1,cblksty);
  return;
}

Assistant:

static void opj_t1_dec_clnpass(
    opj_t1_t *t1,
    OPJ_INT32 bpno,
    OPJ_INT32 cblksty)
{
    if (t1->w == 64 && t1->h == 64) {
        if (cblksty & J2K_CCP_CBLKSTY_VSC) {
            opj_t1_dec_clnpass_64x64_vsc(t1, bpno);
        } else {
            opj_t1_dec_clnpass_64x64_novsc(t1, bpno);
        }
    } else {
        if (cblksty & J2K_CCP_CBLKSTY_VSC) {
            opj_t1_dec_clnpass_generic_vsc(t1, bpno);
        } else {
            opj_t1_dec_clnpass_generic_novsc(t1, bpno);
        }
    }
    opj_t1_dec_clnpass_check_segsym(t1, cblksty);
}